

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::detail::ExpressionLHS<int>::GetResult
          (AssertionResult *__return_storage_ptr__,ExpressionLHS<int> *this,bool expected)

{
  AssertionResult *pAVar1;
  AssertionResult local_48;
  undefined1 local_1a;
  undefined1 local_19;
  bool b;
  ExpressionLHS<int> *pEStack_18;
  bool expected_local;
  ExpressionLHS<int> *this_local;
  
  local_1a = this->m_lhs != 0;
  local_19 = expected;
  pEStack_18 = this;
  this_local = (ExpressionLHS<int> *)__return_storage_ptr__;
  AssertionResult::AssertionResult(&local_48,(bool)local_1a == expected);
  pAVar1 = AssertionResult::operator<<(&local_48,(char (*) [12])"expansion: ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&this->m_message);
  AssertionResult::AssertionResult(__return_storage_ptr__,pAVar1);
  AssertionResult::~AssertionResult(&local_48);
  return __return_storage_ptr__;
}

Assistant:

AssertionResult GetResult(bool expected) const
    {
        const bool b = m_lhs ? true : false;
        return AssertionResult(b == expected) << "expansion: " << m_message;
    }